

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

real __thiscall fasttext::Vector::norm(Vector *this)

{
  float *pfVar1;
  size_t sVar2;
  size_t sVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  sVar2 = (this->data_).size_;
  auVar5 = ZEXT816(0) << 0x40;
  if (0 < (long)sVar2) {
    sVar3 = 0;
    do {
      pfVar1 = (this->data_).mem_ + sVar3;
      sVar3 = sVar3 + 1;
      auVar6 = ZEXT416((uint)*pfVar1);
      auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
    } while (sVar2 != sVar3);
  }
  if (0.0 <= auVar5._0_4_) {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    return auVar5._0_4_;
  }
  fVar4 = sqrtf(auVar5._0_4_);
  return fVar4;
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}